

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<64>,Blob<160>>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  bool result;
  int i;
  Blob<160> h2;
  Blob<160> h1;
  Blob<64> k2;
  Blob<64> k1;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff1c;
  Rand *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  Blob<64> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Blob<160> *h1_00;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar2;
  int iVar3;
  int iVar4;
  int in_stack_ffffffffffffff5c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff78;
  Blob<64> local_7c [2];
  Blob<64> local_68 [6];
  double local_38;
  Blob<160> *local_30;
  double local_28;
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_11 = in_CL & 1;
  local_18 = 0x40;
  local_1c = 0xa0;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                         (int)in_stack_ffffffffffffff20);
  h1_00 = (Blob<160> *)(local_28 * (double)(int)local_10);
  local_30 = h1_00;
  local_38 = pow(2.0,160.0);
  local_38 = (double)h1_00 / local_38;
  Rand::Rand(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)0x171ce1);
  Blob<64>::Blob(local_68);
  Blob<64>::Blob(local_7c);
  Blob<160>::Blob((Blob<160> *)&stack0xffffffffffffff70);
  Blob<160>::Blob((Blob<160> *)&stack0xffffffffffffff5c);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",local_28,
         (ulong)local_c,0x40,0xa0);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",local_30,local_38,
         (ulong)local_10);
  iVar3 = 0;
  while (iVar3 < (int)local_10) {
    iVar4 = iVar3;
    if (iVar3 % ((int)local_10 / 10) == 0) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT44(iVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
                 CONCAT13(in_stack_ffffffffffffff37,
                          CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)));
    in_stack_ffffffffffffff38 = local_68;
    Blob<64>::operator=(local_7c,in_stack_ffffffffffffff38);
    (*local_8)(in_stack_ffffffffffffff38,8,0,&stack0xffffffffffffff70);
    DiffTestRecurse<Blob<64>,Blob<160>>
              ((pfHash)in_stack_ffffffffffffff60,
               (Blob<64> *)CONCAT44(in_stack_ffffffffffffff5c,iVar4),
               (Blob<64> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),h1_00,
               (Blob<160> *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff78);
    iVar3 = iVar4 + 1;
  }
  printf("\n");
  bVar2 = 1;
  bVar1 = ProcessDifferentials<Blob<64>>
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     SUB41((uint)iVar3 >> 0x18,0));
  bVar2 = (bVar2 & 1 & bVar1) != 0;
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::~vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)
             CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30))));
  return (bool)(bVar2 & 1);
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}